

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::javanano::IsOuterClassNeeded(Params *params,FileDescriptor *file)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = Params::java_multiple_files(params,*(string **)file);
  bVar2 = true;
  if (((bVar1) && (*(int *)(file + 0x88) == 0)) &&
     ((*(int *)(file + 0x68) == 0 || (params->java_enum_style_ == true)))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsOuterClassNeeded(const Params& params, const FileDescriptor* file) {
  // If java_multiple_files is false, the outer class is always needed.
  if (!params.java_multiple_files(file->name())) {
    return true;
  }

  // File-scope extensions need the outer class as the scope.
  if (file->extension_count() != 0) {
    return true;
  }

  // If container interfaces are not generated, file-scope enums need the
  // outer class as the scope.
  if (file->enum_type_count() != 0 && !params.java_enum_style()) {
    return true;
  }

  return false;
}